

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::LocalAccessChainConvertPass::ProcessImpl(LocalAccessChainConvertPass *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  pointer puVar3;
  bool bVar4;
  Status SVar5;
  Instruction **ppIVar6;
  Instruction *ai;
  Status SVar7;
  pointer puVar8;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)
            ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    pIVar2 = *ppIVar6;
    if (pIVar2 == (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
      bVar4 = AllExtensionsSupported(this);
      if (!bVar4) {
        return SuccessWithoutChange;
      }
      pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      puVar8 = *(pointer *)
                &(pMVar1->functions_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                 ._M_impl;
      puVar3 = *(pointer *)
                ((long)&(pMVar1->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
      SVar7 = SuccessWithoutChange;
      do {
        if (puVar8 == puVar3) {
          return SVar7;
        }
        SVar5 = ConvertLocalAccessChains
                          (this,(Function *)
                                (puVar8->_M_t).
                                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                          );
        if ((int)SVar5 < (int)SVar7) {
          SVar7 = SVar5;
        }
        puVar8 = puVar8 + 1;
      } while (SVar7 != Failure);
      return Failure;
    }
    ppIVar6 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (pIVar2->opcode_ != OpGroupDecorate);
  return SuccessWithoutChange;
}

Assistant:

Pass::Status LocalAccessChainConvertPass::ProcessImpl() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Do not process if any disallowed extensions are enabled
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;

  // Process all functions in the module.
  Status status = Status::SuccessWithoutChange;
  for (Function& func : *get_module()) {
    status = CombineStatus(status, ConvertLocalAccessChains(&func));
    if (status == Status::Failure) {
      break;
    }
  }
  return status;
}